

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_paramSwitch_e
ZSTD_resolveRowMatchFinderMode(ZSTD_paramSwitch_e mode,ZSTD_compressionParameters *cParams)

{
  int iVar1;
  int kHasSIMD128;
  ZSTD_compressionParameters *cParams_local;
  ZSTD_paramSwitch_e mode_local;
  
  cParams_local._4_4_ = mode;
  if (mode == ZSTD_ps_auto) {
    cParams_local._0_4_ = ZSTD_ps_disable;
    iVar1 = ZSTD_rowMatchFinderSupported(cParams->strategy);
    if (iVar1 == 0) {
      cParams_local._4_4_ = ZSTD_ps_disable;
    }
    else {
      if (0xe < cParams->windowLog) {
        cParams_local._0_4_ = ZSTD_ps_enable;
      }
      cParams_local._4_4_ = (ZSTD_paramSwitch_e)cParams_local;
    }
  }
  return cParams_local._4_4_;
}

Assistant:

static ZSTD_paramSwitch_e ZSTD_resolveRowMatchFinderMode(ZSTD_paramSwitch_e mode,
                                                         const ZSTD_compressionParameters* const cParams) {
#if defined(ZSTD_ARCH_X86_SSE2) || defined(ZSTD_ARCH_ARM_NEON)
    int const kHasSIMD128 = 1;
#else
    int const kHasSIMD128 = 0;
#endif
    if (mode != ZSTD_ps_auto) return mode; /* if requested enabled, but no SIMD, we still will use row matchfinder */
    mode = ZSTD_ps_disable;
    if (!ZSTD_rowMatchFinderSupported(cParams->strategy)) return mode;
    if (kHasSIMD128) {
        if (cParams->windowLog > 14) mode = ZSTD_ps_enable;
    } else {
        if (cParams->windowLog > 17) mode = ZSTD_ps_enable;
    }
    return mode;
}